

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O1

char ** apprun_file_read_lines(char *filename)

{
  FILE *__stream;
  char **ppcVar1;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    ppcVar1 = (char **)0x0;
  }
  else {
    ppcVar1 = apprun_read_lines((FILE *)__stream);
    ppcVar1 = apprun_adjust_string_array_size(ppcVar1);
    fclose(__stream);
  }
  return ppcVar1;
}

Assistant:

char **apprun_file_read_lines(const char *filename) {
    char **result = NULL;

    FILE *fp = fopen(filename, "r");
    if (fp) {
        result = apprun_read_lines(fp);
        result = apprun_adjust_string_array_size(result);
        fclose(fp);
    }

    return result;
}